

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O3

ngx_int_t ngx_http_upsync_init_module(ngx_cycle_t *cycle)

{
  int __fd;
  ngx_http_upsync_server_t *pnVar1;
  ngx_http_upsync_srv_conf_t *pnVar2;
  ngx_int_t nVar3;
  ngx_shmtx_sh_t *addr;
  ngx_shmtx_t *mtx;
  ngx_http_upsync_srv_conf_t **ppnVar4;
  ulong uVar5;
  ngx_shm_t local_60;
  
  if (upsync_ctx == (ngx_http_upsync_main_conf_t *)0x0) {
LAB_00182f9f:
    nVar3 = 0;
  }
  else {
    pnVar1 = upsync_ctx->upsync_server;
    if (*upsync_shared_created != 0) {
      local_60.size = *upsync_shared_created << 7;
      local_60.log = cycle->log;
      local_60.addr = (u_char *)upsync_shared_created;
      local_60.name.len = 0x17;
      local_60.name.data = "ngx_upsync_shared_zone";
      ngx_shm_free(&local_60);
    }
    local_60.size = upsync_ctx->upstream_num * 0x80 + 0x80;
    local_60.log = cycle->log;
    local_60.name.len = 0x17;
    local_60.name.data = "ngx_upsync_shared_zone";
    nVar3 = ngx_shm_alloc(&local_60);
    if (nVar3 == 0) {
      upsync_shared_created = (ngx_atomic_t *)local_60.addr;
      uVar5 = 0xffffffffffffffff;
      mtx = &pnVar1->upsync_accept_mutex;
      addr = (ngx_shmtx_sh_t *)local_60.addr;
      do {
        addr = addr + 0x10;
        uVar5 = uVar5 + 1;
        if (upsync_ctx->upstream_num <= uVar5) {
          LOCK();
          if (*upsync_shared_created == *upsync_shared_created) {
            *upsync_shared_created = upsync_ctx->upstream_num;
          }
          UNLOCK();
          if (upsync_ctx->upstream_num != 0) {
            ppnVar4 = &pnVar1->upscf;
            uVar5 = 0;
            do {
              pnVar2 = *ppnVar4;
              __fd = pnVar2->conf_file->fd;
              if (__fd != -1) {
                close(__fd);
                pnVar2->conf_file->fd = -1;
              }
              chmod((char *)(pnVar2->upsync_dump_path).data,0x1a6);
              uVar5 = uVar5 + 1;
              ppnVar4 = ppnVar4 + 0x5e;
            } while (uVar5 < upsync_ctx->upstream_num);
            return 0;
          }
          goto LAB_00182f9f;
        }
        nVar3 = ngx_shmtx_create(mtx,addr,(u_char *)0x0);
        mtx = mtx + 0x2f;
      } while (nVar3 == 0);
    }
    nVar3 = -1;
    if (3 < cycle->log->log_level) {
      ngx_log_error_core(4,cycle->log,0,"upsync_init_module: init shm mutex failed");
    }
  }
  return nVar3;
}

Assistant:

static ngx_int_t 
ngx_http_upsync_init_module(ngx_cycle_t *cycle)
{
    ngx_uint_t                       i;
    ngx_http_upsync_server_t        *upsync_server;
    ngx_http_upsync_srv_conf_t      *upscf;

    // no http {} block found
    if (upsync_ctx == NULL) {
        return NGX_OK;
    }
    upsync_server = upsync_ctx->upsync_server;

    if (ngx_http_upsync_init_shm_mutex(cycle) != NGX_OK) {
        ngx_log_error(NGX_LOG_ERR, cycle->log, 0, "upsync_init_module:"
                      " init shm mutex failed");
        return NGX_ERROR;
    }

    for (i = 0; i < upsync_ctx->upstream_num; i++) {

        upscf = upsync_server[i].upscf;
        if (upscf->conf_file->fd != NGX_INVALID_FILE) {
            ngx_close_file(upscf->conf_file->fd);
            upscf->conf_file->fd = NGX_INVALID_FILE;
        }
        ngx_change_file_access(upscf->upsync_dump_path.data, 
                               S_IRUSR|S_IWUSR|S_IRGRP|S_IROTH|S_IWOTH);
    }

    return NGX_OK;
}